

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  bool bVar1;
  bool bVar2;
  ImVec2 *in_RSI;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  float in_stack_00000068;
  ImGuiDir in_stack_0000006c;
  ImVec2 in_stack_00000070;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ImGuiWindow *in_stack_ffffffffffffff60;
  ImDrawList *centre;
  float in_stack_ffffffffffffff70;
  ImGuiCol idx;
  ImRect *nav_bb_arg;
  ImRect *in_stack_ffffffffffffff88;
  undefined1 local_70 [4];
  ImGuiID in_stack_ffffffffffffff94;
  ImRect *in_stack_ffffffffffffff98;
  byte local_52;
  byte local_51;
  ImVec2 local_40;
  ImVec2 local_38;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  nav_bb_arg = (ImRect *)&stack0xffffffffffffffb8;
  ImVec2::ImVec2((ImVec2 *)nav_bb_arg,GImGui->FontSize,GImGui->FontSize);
  local_40 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (ImVec2 *)0x176d7d);
  operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0.0);
  local_38 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (ImVec2 *)0x176db4);
  ImRect::ImRect(&local_30,in_RSI,&local_38);
  ItemAdd(in_stack_ffffffffffffff88,(ImGuiID)((ulong)in_RSI >> 0x20),nav_bb_arg);
  bVar1 = ButtonBehavior(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         (bool *)in_stack_ffffffffffffff88,(bool *)in_RSI,
                         (ImGuiButtonFlags)((ulong)nav_bb_arg >> 0x20));
  if (((local_52 & 1) == 0) || ((local_51 & 1) == 0)) {
    idx = 0x15;
    if ((local_51 & 1) != 0) {
      idx = 0x16;
    }
  }
  else {
    idx = 0x17;
  }
  GetColorU32(idx,in_stack_ffffffffffffff70);
  if (((local_51 & 1) != 0) || ((local_52 & 1) != 0)) {
    centre = local_20->DrawList;
    ImRect::GetCenter((ImRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff60 = (ImGuiWindow *)local_70;
    ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff60,0.0,-0.5);
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
              (ImVec2 *)0x176eac);
    ImDrawList::AddCircleFilled
              ((ImDrawList *)CONCAT44(idx,in_stack_ffffffffffffff70),(ImVec2 *)centre,
               (float)((ulong)in_stack_ffffffffffffff60 >> 0x20),(ImU32)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c);
  }
  operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
            (ImVec2 *)0x176f0b);
  RenderArrow(in_stack_00000070,in_stack_0000006c,in_stack_00000068);
  bVar2 = IsItemActive();
  if ((bVar2) && (bVar2 = IsMouseDragging(0,-1.0), bVar2)) {
    StartMouseMovingWindow(in_stack_ffffffffffffff60);
  }
  return bVar1;
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    if (hovered || held)
        window->DrawList->AddCircleFilled(bb.GetCenter() + ImVec2(0.0f, -0.5f), g.FontSize * 0.5f + 1.0f, col, 9);
    RenderArrow(bb.Min + g.Style.FramePadding, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging())
        StartMouseMovingWindow(window);

    return pressed;
}